

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

String __thiscall
testing::internal::StreamableToString<wchar_t*>(internal *this,wchar_t **streamable)

{
  Message *pMVar1;
  size_t extraout_RDX;
  String SVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  size_t sVar2;
  
  Message::Message((Message *)&local_20);
  pMVar1 = Message::operator<<((Message *)&local_20,*streamable);
  SVar3 = StringStreamToString(this,(pMVar1->ss_).ptr_);
  sVar2 = SVar3.length_;
  if (local_20.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20.ptr_ + 8))();
    sVar2 = extraout_RDX;
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}